

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_to_bitset(roaring_bitmap_t *r,bitset_t *bitset)

{
  uint uVar1;
  int *candidate_shared_container;
  ulong uVar2;
  long *in_RSI;
  int *in_RDI;
  rle16_t rle;
  int32_t rlepos;
  run_container_t *src_2;
  array_container_t *src_1;
  bitset_container_t *src;
  size_t max_word_index;
  container_t *c;
  uint8_t type;
  uint64_t *words;
  int i;
  roaring_array_t *ra;
  _Bool resize_ok;
  size_t new_array_size;
  uint32_t max_value;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  ushort in_stack_ffffffffffffff82;
  int in_stack_ffffffffffffff84;
  roaring_bitmap_t *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 padwithzeroes;
  size_t in_stack_ffffffffffffffa0;
  bitset_t *in_stack_ffffffffffffffa8;
  uint8_t local_49;
  uint64_t *local_48;
  int local_3c;
  int *local_38;
  undefined1 local_29;
  ulong local_28;
  uint32_t local_1c;
  long *local_18;
  int *local_10;
  _Bool local_1;
  
  padwithzeroes = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_1c = roaring_bitmap_maximum(in_stack_ffffffffffffff88);
  local_28 = (ulong)((local_1c >> 6) + 1);
  local_29 = bitset_resize(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(_Bool)padwithzeroes)
  ;
  if ((bool)local_29) {
    local_38 = local_10;
    for (local_3c = 0; local_3c < *local_38; local_3c = local_3c + 1) {
      local_48 = (uint64_t *)
                 (*local_18 +
                 (long)(int)((uint)*(ushort *)(*(long *)(local_38 + 4) + (long)local_3c * 2) << 10)
                 * 8);
      local_49 = *(uint8_t *)(*(long *)(local_38 + 6) + (long)local_3c);
      candidate_shared_container = *(int **)(*(long *)(local_38 + 2) + (long)local_3c * 8);
      if (local_49 == '\x04') {
        candidate_shared_container =
             (int *)container_unwrap_shared(candidate_shared_container,&local_49);
      }
      if (local_49 == '\x01') {
        uVar2 = local_28 -
                (long)(int)((uint)*(ushort *)(*(long *)(local_38 + 4) + (long)local_3c * 2) << 10);
        if (0x400 < uVar2) {
          uVar2 = 0x400;
        }
        memcpy(local_48,*(void **)(candidate_shared_container + 2),uVar2 << 3);
      }
      else if (local_49 == '\x02') {
        bitset_set_list((uint64_t *)
                        CONCAT44(in_stack_ffffffffffffff84,
                                 CONCAT22(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80)),
                        (uint16_t *)(ulong)CONCAT14(2,in_stack_ffffffffffffff78),0x10f37d);
      }
      else {
        for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < *candidate_shared_container;
            in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
          uVar1 = *(uint *)(*(long *)(candidate_shared_container + 2) +
                           (long)in_stack_ffffffffffffff84 * 4);
          in_stack_ffffffffffffff80 = (undefined2)uVar1;
          in_stack_ffffffffffffff82 = (ushort)(uVar1 >> 0x10);
          bitset_set_lenrange(local_48,uVar1 & 0xffff,(uint)in_stack_ffffffffffffff82);
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool roaring_bitmap_to_bitset(const roaring_bitmap_t *r, bitset_t *bitset) {
    uint32_t max_value = roaring_bitmap_maximum(r);
    size_t new_array_size = (size_t)(max_value / 64 + 1);
    bool resize_ok = bitset_resize(bitset, new_array_size, true);
    if (!resize_ok) {
        return false;
    }
    const roaring_array_t *ra = &r->high_low_container;
    for (int i = 0; i < ra->size; ++i) {
        uint64_t *words = bitset->array + (ra->keys[i] << 10);
        uint8_t type = ra->typecodes[i];
        const container_t *c = ra->containers[i];
        if (type == SHARED_CONTAINER_TYPE) {
            c = container_unwrap_shared(c, &type);
        }
        switch (type) {
            case BITSET_CONTAINER_TYPE: {
                size_t max_word_index = new_array_size - (ra->keys[i] << 10);
                if (max_word_index > 1024) {
                    max_word_index = 1024;
                }
                const bitset_container_t *src = const_CAST_bitset(c);
                memcpy(words, src->words, max_word_index * sizeof(uint64_t));
            } break;
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *src = const_CAST_array(c);
                bitset_set_list(words, src->array, src->cardinality);
            } break;
            case RUN_CONTAINER_TYPE: {
                const run_container_t *src = const_CAST_run(c);
                for (int32_t rlepos = 0; rlepos < src->n_runs; ++rlepos) {
                    rle16_t rle = src->runs[rlepos];
                    bitset_set_lenrange(words, rle.value, rle.length);
                }
            } break;
            default:
                roaring_unreachable;
        }
    }
    return true;
}